

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

int Bmc_CollapseIrredundantFull(Vec_Str_t *vSop,int nCubes,int nVars)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p;
  int *piVar6;
  void *pvVar7;
  ulong uVar8;
  sat_solver *s;
  int *begin;
  size_t __size;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  int local_74;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < (nCubes + nVars) - 1U) {
    iVar4 = nCubes + nVars;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar6;
  pcVar13 = vSop->pArray;
  piVar6 = (int *)malloc(0x10);
  uVar10 = 8;
  if (6 < nCubes - 1U) {
    uVar10 = (ulong)(uint)nCubes;
  }
  piVar6[1] = 0;
  iVar4 = (int)uVar10;
  *piVar6 = iVar4;
  if (iVar4 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)iVar4 << 3);
  }
  *(void **)(piVar6 + 2) = pvVar7;
  uVar8 = (long)nVars + 3;
  if (vSop->nSize != (int)uVar8 * nCubes + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x11c,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
  }
  cVar2 = *pcVar13;
  if (cVar2 != '\0') {
    __size = 0;
    uVar14 = 0;
    uVar12 = 0;
    do {
      if ((int)uVar12 == (int)uVar10) {
        pvVar7 = *(void **)(piVar6 + 2);
        if (uVar12 < 0x10) {
          if (pvVar7 == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(pvVar7,0x80);
          }
          *(void **)(piVar6 + 2) = pvVar7;
          uVar10 = 0x10;
        }
        else {
          if (pvVar7 == (void *)0x0) {
            pvVar7 = malloc(__size);
          }
          else {
            pvVar7 = realloc(pvVar7,__size);
          }
          *(void **)(piVar6 + 2) = pvVar7;
          uVar10 = uVar14;
        }
      }
      else {
        pvVar7 = *(void **)(piVar6 + 2);
      }
      *(char **)((long)pvVar7 + uVar12 * 8) = pcVar13;
      uVar12 = uVar12 + 1;
      uVar14 = (ulong)((int)uVar14 + 2);
      __size = __size + 0x10;
      pcVar1 = pcVar13 + uVar8;
      pcVar13 = pcVar13 + uVar8;
    } while (*pcVar1 != '\0');
    piVar6[1] = (int)uVar12;
    *piVar6 = (int)uVar10;
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nCubes + nVars);
  if (cVar2 != '\0') {
    lVar3 = *(long *)(piVar6 + 2);
    lVar15 = 0;
    do {
      if (nVars < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pcVar13 = *(char **)(lVar3 + lVar15 * 8);
      begin = p->pArray;
      if (p->nCap < 1) {
        if (begin == (int *)0x0) {
          begin = (int *)malloc(4);
        }
        else {
          begin = (int *)realloc(begin,4);
        }
        p->pArray = begin;
        if (begin == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p->nCap = 1;
      }
      *begin = ((int)lVar15 + nVars) * 2 + 1;
      p->nSize = 1;
      if (nVars < 1) {
        lVar9 = 1;
      }
      else {
        lVar9 = 0;
        do {
          if (*pcVar13 != '-') {
            Vec_IntPush(p,(uint)(*pcVar13 == '0') + (int)lVar9);
          }
          lVar9 = lVar9 + 2;
          pcVar13 = pcVar13 + 1;
        } while ((ulong)(uint)nVars * 2 != lVar9);
        begin = p->pArray;
        lVar9 = (long)p->nSize;
      }
      iVar4 = sat_solver_addclause(s,begin,begin + lVar9);
      if (iVar4 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                      ,300,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
      }
      lVar15 = lVar15 + 1;
      uVar5 = piVar6[1];
      uVar10 = (ulong)(int)uVar5;
    } while (lVar15 < (long)uVar10);
    if ((int)uVar5 < 1) goto LAB_0058bab1;
    lVar3 = *(long *)(piVar6 + 2);
    uVar12 = 0;
    local_74 = 0;
    do {
      pcVar13 = *(char **)(lVar3 + uVar12 * 8);
      p->nSize = 0;
      if (0 < nCubes) {
        uVar14 = 0;
        iVar4 = nVars * 2;
        do {
          if (uVar12 != uVar14) {
            if (uVar10 <= uVar14) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (*(long *)(lVar3 + uVar14 * 8) != 0) {
              Vec_IntPush(p,iVar4);
            }
          }
          uVar14 = uVar14 + 1;
          iVar4 = iVar4 + 2;
        } while ((uint)nCubes != uVar14);
      }
      if (nVars != 0) {
        lVar15 = 0;
        do {
          if (*pcVar13 != '-') {
            Vec_IntPush(p,(uint)(*pcVar13 == '1') + (int)lVar15);
          }
          lVar15 = lVar15 + 2;
          pcVar13 = pcVar13 + 1;
        } while ((ulong)(uint)nVars * 2 != lVar15);
      }
      iVar4 = sat_solver_solve(s,p->pArray,p->pArray + p->nSize,0,0,0,0);
      if (iVar4 == -1) {
        *(undefined8 *)(lVar3 + uVar12 * 8) = 0;
        local_74 = local_74 + 1;
      }
      else if (iVar4 != 1) {
        if (iVar4 != 0) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                        ,0x145,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
        }
        goto LAB_0058b9ed;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar10);
    uVar12 = (ulong)uVar5;
LAB_0058b9ed:
    if ((uint)uVar12 != uVar5 || local_74 < 1) goto LAB_0058bab1;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
      iVar4 = 1;
    }
    else {
      lVar3 = *(long *)(piVar6 + 2);
      uVar12 = 1;
      if (1 < (int)uVar8) {
        uVar12 = uVar8 & 0xffffffff;
      }
      uVar14 = 0;
      uVar8 = 0;
      do {
        lVar15 = *(long *)(lVar3 + uVar14 * 8);
        if (lVar15 != 0) {
          iVar4 = (int)uVar8;
          uVar11 = 0;
          do {
            if ((iVar4 < 0) || (vSop->nSize <= iVar4 + (int)uVar11)) goto LAB_0058baff;
            vSop->pArray[uVar11 + uVar8] = *(char *)(lVar15 + uVar11);
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
          uVar8 = (ulong)(uint)((int)uVar12 + iVar4);
        }
        uVar5 = (uint)uVar8;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar10);
      if ((int)uVar5 < 0) goto LAB_0058baff;
      iVar4 = uVar5 + 1;
    }
    if (vSop->nSize <= (int)uVar5) {
LAB_0058baff:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                    ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
    }
    vSop->pArray[uVar5] = '\0';
    if (vSop->nSize <= (int)uVar5) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                    ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
    }
    vSop->nSize = iVar4;
  }
LAB_0058bab1:
  sat_solver_delete(s);
  if (*(void **)(piVar6 + 2) != (void *)0x0) {
    free(*(void **)(piVar6 + 2));
  }
  free(piVar6);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return 0;
}

Assistant:

int Bmc_CollapseIrredundantFull( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars+nCubes);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars + nCubes );
    // add cubes
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(nVars + i, 1) ); // neg literal
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '0') );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through cubes in the direct order
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && Vec_PtrEntry(vCubes, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(nVars + k, 0) ); // pos literal
        // collect cube
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == Vec_PtrSize(vCubes) && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}